

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test2D.cpp
# Opt level: O3

bool tfs::localTest2d(DnnTrainer *trainer,vector<double,_std::allocator<double>_> *data,
                     vector<long,_std::allocator<long>_> *label,char *trainingName,
                     unsigned_long max_iteration)

{
  ulong uVar1;
  pointer plVar2;
  DNN_INTEGER *pDVar3;
  double *pdVar4;
  DNN_INTEGER expectation;
  Matrix *pMVar5;
  ulong uVar6;
  long lVar7;
  unsigned_long line;
  uint ii;
  int iVar8;
  char *format;
  double *pdVar9;
  DNN_INTEGER *pDVar10;
  bool bVar11;
  DNN_NUMERIC DVar12;
  undefined1 auVar13 [16];
  double dVar14;
  
  pMVar5 = DnnTrainer::getMatrixInput(trainer);
  if (pMVar5 == (Matrix *)0x0) {
    format = "Unable to obtain input matrix.";
    line = 0x8f;
  }
  else if ((data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start == (pointer)0x0) {
    format = "Unable to obtain input data.";
    line = 0x93;
  }
  else {
    plVar2 = (label->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (plVar2 == (pointer)0x0) {
      format = "Unable to obtain input labels.";
      line = 0x97;
    }
    else {
      pDVar3 = (label->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      uVar6 = (long)pDVar3 - (long)plVar2;
      if (uVar6 != 0) {
        lVar7 = (uVar6 >> 3) * 200;
        auVar13._8_4_ = (int)((ulong)lVar7 >> 0x20);
        auVar13._0_8_ = lVar7;
        auVar13._12_4_ = 0x45300000;
        uVar6 = 0;
        do {
          dVar14 = 0.0;
          iVar8 = 0;
          do {
            pDVar10 = (label->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            if (pDVar10 < pDVar3) {
              pdVar9 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              do {
                pdVar4 = pMVar5->m_data;
                *pdVar4 = *pdVar9;
                pdVar4[1] = pdVar9[1];
                expectation = *pDVar10;
                pDVar10 = pDVar10 + 1;
                DVar12 = DnnTrainer::train(trainer,expectation);
                dVar14 = dVar14 + DVar12;
                pdVar9 = pdVar9 + 2;
              } while (pDVar10 < pDVar3);
            }
            iVar8 = iVar8 + 1;
          } while (iVar8 != 200);
          uVar1 = uVar6 + 1;
          dVar14 = dVar14 / ((auVar13._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0));
        } while ((0.02 < dVar14) && (bVar11 = uVar6 < 199, uVar6 = uVar1, bVar11));
        report_message("Info ",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/test2D.cpp"
                       ,"localTest2d",0xb3,"Average loss = %f/%f. Count = %lu/%lu (%s)",dVar14,
                       0x3f947ae147ae147b,uVar1,200,trainingName);
        return true;
      }
      format = "Label data size < 1";
      line = 0x9b;
    }
  }
  bVar11 = report_problem("Error",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/test2D.cpp"
                          ,"localTest2d",line,format);
  return bVar11;
}

Assistant:

static bool
    localTest2d( DnnTrainer &trainer,
                const std::vector< DNN_NUMERIC > &data,
                const std::vector< DNN_INTEGER > &label,
                const char *trainingName,
                const unsigned long max_iteration = 200 ) {
        Matrix *input = trainer.getMatrixInput();       // get the input matrix: x,y pair Matrix( 1, 1, 2 )
        if( input == 0 ) {
            return log_error( "Unable to obtain input matrix." );
        }
        const DNN_NUMERIC *dPtr = data.data();
        if( dPtr == 0 ) {
            return log_error( "Unable to obtain input data." );
        }
        const DNN_INTEGER *lPtr = label.data();
        if( lPtr == 0 ) {
            return log_error( "Unable to obtain input labels." );
        }
        const unsigned long DATA_COUNT = label.size();
        if( DATA_COUNT < 1 ) {
            return log_error( "Label data size < 1" );
        }
        const DNN_INTEGER * const ePtr = lPtr + DATA_COUNT;

        const unsigned int      MAX_EPOCH = 200;
        const DNN_NUMERIC     TARGET_LOSS = 0.02;
        unsigned long      iterationCount = 0;
        DNN_NUMERIC          average_loss = 0.0;
        do {
            iterationCount++;
            average_loss = 0.0;
            for( unsigned int ii = 0; ii < MAX_EPOCH; ii++ ) {
                dPtr = data.data();
                lPtr = label.data();
                
                while( lPtr < ePtr ) {
                    DNN_NUMERIC *inPtr = input->data();
                    *inPtr++ = *dPtr++;     // x
                    *inPtr   = *dPtr++;     // y
                    average_loss += trainer.train( *lPtr++ );
                }
            }
            average_loss /= DATA_COUNT * MAX_EPOCH;
        } while( average_loss > TARGET_LOSS && iterationCount < max_iteration );
        log_info( "Average loss = %f/%f. Count = %lu/%lu (%s)", average_loss, TARGET_LOSS, iterationCount, max_iteration, trainingName );
        return true;
    }